

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_aead_transform(ptls_aead_context_t *ctx,void *output,size_t *outlen,void *input,
                       size_t inlen,uint8_t enc_content_type)

{
  long local_80;
  size_t i;
  uint8_t *d;
  uint8_t *s;
  int ret;
  size_t iv_size;
  uint8_t iv [16];
  uint8_t enc_content_type_local;
  size_t inlen_local;
  void *input_local;
  size_t *outlen_local;
  void *output_local;
  ptls_aead_context_t *ctx_local;
  
  i = (size_t)&iv_size;
  d = ctx->static_iv;
  for (local_80 = ctx->algo->iv_size - 8; local_80 != 0; local_80 = local_80 + -1) {
    *(uint8_t *)i = *d;
    i = i + 1;
    d = d + 1;
  }
  local_80 = 0x40;
  do {
    local_80 = local_80 + -8;
    *(byte *)i = *d ^ (byte)(ctx->seq >> ((byte)local_80 & 0x3f));
    i = i + 1;
    d = d + 1;
  } while (local_80 != 0);
  ctx_local._4_4_ = (*ctx->do_transform)(ctx,output,outlen,input,inlen,&iv_size,enc_content_type);
  if (ctx_local._4_4_ == 0) {
    ctx->seq = ctx->seq + 1;
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int ptls_aead_transform(ptls_aead_context_t *ctx, void *output, size_t *outlen, const void *input, size_t inlen,
                        uint8_t enc_content_type)
{
    uint8_t iv[PTLS_MAX_IV_SIZE];
    size_t iv_size = ctx->algo->iv_size;
    int ret;

    { /* build iv */
        const uint8_t *s = ctx->static_iv;
        uint8_t *d = iv;
        size_t i = iv_size - 8;
        for (; i != 0; --i)
            *d++ = *s++;
        i = 64;
        do {
            i -= 8;
            *d++ = *s++ ^ (uint8_t)(ctx->seq >> i);
        } while (i != 0);
    }

    if ((ret = ctx->do_transform(ctx, output, outlen, input, inlen, iv, enc_content_type)) != 0)
        return ret;

    ++ctx->seq;
    return 0;
}